

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketsOps.cpp
# Opt level: O0

int sznet::net::sockets::sz_sock_setnonblock(sz_sock sock,bool nonblock)

{
  undefined4 local_18;
  int flag;
  int iStack_c;
  bool nonblock_local;
  sz_sock sock_local;
  
  local_18 = fcntl64(sock,3,0);
  if (local_18 == 0xffffffff) {
    iStack_c = -1;
  }
  else {
    if (nonblock) {
      local_18 = local_18 | 0x800;
    }
    else {
      local_18 = local_18 & 0xfffff7ff;
    }
    iStack_c = fcntl64(sock,4,local_18);
  }
  return iStack_c;
}

Assistant:

int sz_sock_setnonblock(sz_sock sock, bool nonblock)
{
#ifdef SZ_OS_LINUX
	int flag = ::fcntl(sock, F_GETFL, 0);
	if (flag == -1)
	{
		return -1;
	}

	if (nonblock)
	{
		flag |= O_NONBLOCK;
	}
	else
	{
		flag &= ~O_NONBLOCK;
	}
	return ::fcntl(sock, F_SETFL, flag);
#else
	u_long flag = nonblock ? 1 : 0;
	return ioctlsocket(sock, FIONBIO, &flag);
#endif
}